

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O1

LabeledDataset * __thiscall
notch::core::LabeledDataset::append(LabeledDataset *this,Input *input,Output *output)

{
  Output output_copy;
  Input input_copy;
  value_type local_38;
  value_type local_28;
  
  if (this->nSamples == 0) {
    this->inputDimension = input->_M_size;
    this->outputDimension = output->_M_size;
  }
  else {
    if (this->inputDimension != input->_M_size) {
      __assert_fail("inputDimension == input.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                    ,0xfc,
                    "LabeledDataset &notch::LabeledDataset::append(const Input &, const Output &)");
    }
    if (this->outputDimension != output->_M_size) {
      __assert_fail("outputDimension == output.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                    ,0xfd,
                    "LabeledDataset &notch::LabeledDataset::append(const Input &, const Output &)");
    }
  }
  this->nSamples = this->nSamples + 1;
  local_28._M_size = input->_M_size;
  local_28._M_data = (float *)operator_new(local_28._M_size << 2);
  if (input->_M_data != (float *)0x0) {
    memcpy(local_28._M_data,input->_M_data,local_28._M_size << 2);
  }
  local_38._M_size = output->_M_size;
  local_38._M_data = (float *)operator_new(local_38._M_size << 2);
  if (output->_M_data != (float *)0x0) {
    memcpy(local_38._M_data,output->_M_data,local_38._M_size << 2);
  }
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::push_back
            (&this->inputs,&local_28);
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::push_back
            (&this->outputs,&local_38);
  operator_delete(local_38._M_data);
  operator_delete(local_28._M_data);
  return this;
}

Assistant:

LabeledDataset &append(const Input &input, const Output &output) {
        if (nSamples != 0) {
            assert(inputDimension == input.size());
            assert(outputDimension == output.size());
        } else {
            inputDimension = input.size();
            outputDimension = output.size();
        }
        nSamples++;
        Input input_copy(input);
        Output output_copy(output);
        inputs.push_back(input_copy);
        outputs.push_back(output_copy);
        return *this;
    }